

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Functional::MultisampleCase::randomizeViewport(MultisampleCase *this)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  GLenum err;
  RenderTarget *pRVar4;
  uint y;
  
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar4->m_width;
  iVar2 = this->m_viewportSize;
  dVar3 = deRandom_getUint32(&(this->m_rnd).m_rnd);
  this->m_viewportX = dVar3 % ((iVar1 - iVar2) + 1U);
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar4->m_height;
  iVar2 = this->m_viewportSize;
  dVar3 = deRandom_getUint32(&(this->m_rnd).m_rnd);
  y = dVar3 % ((iVar1 - iVar2) + 1U);
  this->m_viewportY = y;
  glwViewport(this->m_viewportX,y,this->m_viewportSize,this->m_viewportSize);
  err = glwGetError();
  glu::checkError(err,"glViewport(m_viewportX, m_viewportY, m_viewportSize, m_viewportSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x136);
  return;
}

Assistant:

void MultisampleCase::randomizeViewport (void)
{
	m_viewportX = m_rnd.getInt(0, m_context.getRenderTarget().getWidth() - m_viewportSize);
	m_viewportY = m_rnd.getInt(0, m_context.getRenderTarget().getHeight() - m_viewportSize);

	GLU_CHECK_CALL(glViewport(m_viewportX, m_viewportY, m_viewportSize, m_viewportSize));
}